

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

bool absl::str_format_internal::
     ParseFormatString<absl::str_format_internal::ParsedFormatBase::ParsedFormatConsumer>
               (string_view src,ParsedFormatConsumer consumer)

{
  bool bVar1;
  const_pointer pvVar2;
  size_type sVar3;
  string_view local_c8;
  string_view local_b8;
  undefined1 local_a8 [8];
  UnboundConversion conv_1;
  undefined1 local_84 [8];
  UnboundConversion conv;
  ConvTag tag;
  string_view local_60;
  void *local_50;
  char *percent;
  char *end;
  char *p;
  undefined1 auStack_30 [4];
  int next_arg;
  ParsedFormatConsumer consumer_local;
  string_view src_local;
  
  consumer_local.data_pos = (char *)src._M_len;
  consumer_local.parsed = (ParsedFormatBase *)consumer.data_pos;
  _auStack_30 = consumer.parsed;
  p._4_4_ = 0;
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&consumer_local.data_pos);
  end = pvVar2;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&consumer_local.data_pos);
  percent = pvVar2 + sVar3;
  while( true ) {
    if (end == percent) {
      return true;
    }
    local_50 = memchr(end,0x25,(long)percent - (long)end);
    if (local_50 == (void *)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_60,end,(long)percent - (long)end);
      bVar1 = ParsedFormatBase::ParsedFormatConsumer::Append
                        ((ParsedFormatConsumer *)auStack_30,local_60);
      return bVar1;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&conv.flags,end,
               (long)local_50 - (long)end);
    bVar1 = ParsedFormatBase::ParsedFormatConsumer::Append
                      ((ParsedFormatConsumer *)auStack_30,stack0xffffffffffffff90);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      return false;
    }
    if (percent <= (char *)((long)local_50 + 1U)) break;
    conv.precision.value_._3_1_ = GetTagForChar(*(char *)((long)local_50 + 1));
    bVar1 = ConvTag::is_conv((ConvTag *)((long)&conv.precision.value_ + 3));
    if (bVar1) {
      if (p._4_4_ < 0) {
        return false;
      }
      end = (char *)((long)local_50 + 2);
      UnboundConversion::UnboundConversion((UnboundConversion *)local_84);
      conv.width.value_._2_1_ = ConvTag::as_conv((ConvTag *)((long)&conv.precision.value_ + 3));
      local_84._0_4_ = p._4_4_ + 1;
      p._4_4_ = local_84._0_4_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&conv_1.precision,
                 (char *)((long)local_50 + 1),1);
      bVar1 = ParsedFormatBase::ParsedFormatConsumer::ConvertOne
                        ((ParsedFormatConsumer *)auStack_30,(UnboundConversion *)local_84,
                         stack0xffffffffffffff68);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
    }
    else if (*(char *)((long)local_50 + 1) == '%') {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,"%");
      bVar1 = ParsedFormatBase::ParsedFormatConsumer::Append
                        ((ParsedFormatConsumer *)auStack_30,local_c8);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
      end = (char *)((long)local_50 + 2);
    }
    else {
      UnboundConversion::UnboundConversion((UnboundConversion *)local_a8);
      end = ConsumeUnboundConversionNoInline
                      ((char *)((long)local_50 + 1),percent,(UnboundConversion *)local_a8,
                       (int *)((long)&p + 4));
      if (end == (char *)0x0) {
        return false;
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_b8,(char *)((long)local_50 + 1),(long)end - ((long)local_50 + 1));
      bVar1 = ParsedFormatBase::ParsedFormatConsumer::ConvertOne
                        ((ParsedFormatConsumer *)auStack_30,(UnboundConversion *)local_a8,local_b8);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool ParseFormatString(string_view src, Consumer consumer) {
  int next_arg = 0;
  const char* p = src.data();
  const char* const end = p + src.size();
  while (p != end) {
    const char* percent =
        static_cast<const char*>(memchr(p, '%', static_cast<size_t>(end - p)));
    if (!percent) {
      // We found the last substring.
      return consumer.Append(string_view(p, static_cast<size_t>(end - p)));
    }
    // We found a percent, so push the text run then process the percent.
    if (ABSL_PREDICT_FALSE(!consumer.Append(
            string_view(p, static_cast<size_t>(percent - p))))) {
      return false;
    }
    if (ABSL_PREDICT_FALSE(percent + 1 >= end)) return false;

    auto tag = GetTagForChar(percent[1]);
    if (tag.is_conv()) {
      if (ABSL_PREDICT_FALSE(next_arg < 0)) {
        // This indicates an error in the format string.
        // The only way to get `next_arg < 0` here is to have a positional
        // argument first which sets next_arg to -1 and then a non-positional
        // argument.
        return false;
      }
      p = percent + 2;

      // Keep this case separate from the one below.
      // ConvertOne is more efficient when the compiler can see that the `basic`
      // flag is set.
      UnboundConversion conv;
      conv.conv = tag.as_conv();
      conv.arg_position = ++next_arg;
      if (ABSL_PREDICT_FALSE(
              !consumer.ConvertOne(conv, string_view(percent + 1, 1)))) {
        return false;
      }
    } else if (percent[1] != '%') {
      UnboundConversion conv;
      p = ConsumeUnboundConversionNoInline(percent + 1, end, &conv, &next_arg);
      if (ABSL_PREDICT_FALSE(p == nullptr)) return false;
      if (ABSL_PREDICT_FALSE(!consumer.ConvertOne(
              conv, string_view(percent + 1,
                                static_cast<size_t>(p - (percent + 1)))))) {
        return false;
      }
    } else {
      if (ABSL_PREDICT_FALSE(!consumer.Append("%"))) return false;
      p = percent + 2;
      continue;
    }
  }
  return true;
}